

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O0

string * __thiscall
MetaCommand::GetValueAsString(MetaCommand *this,Option *option,string *fieldName)

{
  bool bVar1;
  __type _Var2;
  ulong uVar3;
  reference pFVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string *in_RDX;
  string *in_RDI;
  const_iterator itField;
  string fieldname;
  vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_> *in_stack_ffffffffffffff68;
  allocator *paVar5;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
  local_58 [3];
  string local_40 [64];
  
  std::__cxx11::string::string(local_40,(string *)in_RCX);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::__cxx11::string::operator=(local_40,in_RDX);
  }
  std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::begin
            (in_stack_ffffffffffffff68);
  __gnu_cxx::
  __normal_iterator<MetaCommand::Field_const*,std::vector<MetaCommand::Field,std::allocator<MetaCommand::Field>>>
  ::__normal_iterator<MetaCommand::Field*>
            ((__normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
              *)in_RDX,
             (__normal_iterator<MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
              *)in_stack_ffffffffffffff68);
  do {
    std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::end
              (in_stack_ffffffffffffff68);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                        *)in_RDX,
                       (__normal_iterator<MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) {
      paVar5 = (allocator *)&stack0xffffffffffffff93;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"",paVar5);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff93);
LAB_001272a0:
      std::__cxx11::string::~string(local_40);
      return in_RDI;
    }
    __gnu_cxx::
    __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
    ::operator*(local_58);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_RCX);
    if (_Var2) {
      pFVar4 = __gnu_cxx::
               __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
               ::operator*(local_58);
      std::__cxx11::string::string((string *)in_RDI,(string *)&pFVar4->value);
      goto LAB_001272a0;
    }
    __gnu_cxx::
    __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
    ::operator++(local_58);
  } while( true );
}

Assistant:

METAIO_STL::string MetaCommand::GetValueAsString(Option option,METAIO_STL::string fieldName)
{
  METAIO_STL::string fieldname = fieldName;
  if (fieldName.empty()) {
    fieldname = option.name;
  }

  METAIO_STL::vector<Field>::const_iterator itField = option.fields.begin();
  while(itField != option.fields.end())
    {
    if((*itField).name == fieldname)
      {
      return (*itField).value;
      }
    ++itField;
    }
  return "";
}